

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void order_update(sat_solver2 *s,int v)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  
  piVar3 = s->orderpos;
  uVar6 = (ulong)piVar3[v];
  if (uVar6 == 0xffffffffffffffff) {
    __assert_fail("s->orderpos[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0xf2,"void order_update(sat_solver2 *, int)");
  }
  piVar4 = (s->order).ptr;
  iVar1 = piVar4[uVar6];
  while( true ) {
    iVar5 = (int)uVar6;
    uVar6 = (long)(iVar5 + -1) / 2;
    if (iVar5 == 0) break;
    iVar2 = piVar4[(int)uVar6];
    if (s->activity[iVar1] <= s->activity[iVar2]) break;
    piVar4[iVar5] = iVar2;
    piVar3[iVar2] = iVar5;
    uVar6 = uVar6 & 0xffffffff;
  }
  piVar4[iVar5] = iVar1;
  piVar3[iVar1] = iVar5;
  return;
}

Assistant:

static inline void order_update(sat_solver2* s, int v) // updateorder
{
    int*      orderpos = s->orderpos;
    int*      heap     = veci_begin(&s->order);
    int       i        = orderpos[v];
    int       x        = heap[i];
    int       parent   = (i - 1) / 2;
    assert(s->orderpos[v] != -1);
    while (i != 0 && s->activity[x] > s->activity[heap[parent]]){
        heap[i]           = heap[parent];
        orderpos[heap[i]] = i;
        i                 = parent;
        parent            = (i - 1) / 2;
    }
    heap[i]     = x;
    orderpos[x] = i;
}